

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Array<capnp::word> * __thiscall
capnp::_::StructReader::canonicalize(Array<capnp::word> *__return_storage_ptr__,StructReader *this)

{
  bool bVar1;
  unsigned_long size_00;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  size_t size_01;
  WireHelpers *this_00;
  ArrayPtr<const_capnp::word> from;
  MessageSizeCounts MVar4;
  ArrayPtr<capnp::word> AVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  ArrayPtr<capnp::word> array;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_1b8;
  undefined1 auStack_1a8 [8];
  ArrayPtr<const_capnp::word> output;
  Fault local_190;
  Fault f;
  undefined1 local_180 [7];
  DebugExpression<bool> _kjCondition;
  PointerBuilder local_168;
  ArrayPtr<capnp::word> local_150;
  undefined1 local_140 [8];
  FlatMessageBuilder builder;
  undefined1 local_48 [8];
  Array<capnp::word> backing;
  WordCountN<61,_uint64_t> size;
  StructReader *this_local;
  Array<capnp::word> *trunc;
  
  MVar4 = totalSize(this);
  backing.disposer = (ArrayDisposer *)MVar4.wordCount;
  size_00 = unbound<unsigned_long>
                      ((unsigned_long)((long)&(backing.disposer)->_vptr_ArrayDisposer + 1));
  kj::heapArray<capnp::word>((Array<capnp::word> *)local_48,size_00);
  AVar5 = kj::Array<capnp::word>::asPtr((Array<capnp::word> *)local_48);
  array.size_ = (word *)AVar5.size_;
  array.ptr = array.size_;
  WireHelpers::zeroMemory<capnp::word>((WireHelpers *)AVar5.ptr,array);
  local_150 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_48);
  FlatMessageBuilder::FlatMessageBuilder((FlatMessageBuilder *)local_140,local_150);
  MessageBuilder::initRoot<capnp::AnyPointer>((Builder *)local_180,(MessageBuilder *)local_140);
  PointerHelpers<capnp::AnyPointer,_(capnp::Kind)7>::getInternalBuilder
            (&local_168,(Builder *)local_180);
  PointerBuilder::setStruct(&local_168,this,true);
  f.exception._6_1_ = MessageBuilder::isCanonical((MessageBuilder *)local_140);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    AVar6 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_140);
    local_1b8.size_ = AVar6.size_;
    pAVar2 = AVar6.ptr;
    local_1b8.ptr = pAVar2;
    pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_1b8,0);
    auStack_1a8 = (undefined1  [8])pAVar3->ptr;
    output.ptr = (word *)pAVar3->size_;
    size_01 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_1a8);
    kj::heapArray<capnp::word>(__return_storage_ptr__,size_01);
    this_00 = (WireHelpers *)kj::Array<capnp::word>::begin(__return_storage_ptr__);
    from.size_ = (size_t)pAVar2;
    from.ptr = output.ptr;
    WireHelpers::copyMemory<capnp::word>(this_00,(word *)auStack_1a8,from);
    FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)local_140);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_48);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xbb6,FAILED,"builder.isCanonical()","_kjCondition,",
             (DebugExpression<bool> *)((long)&f.exception + 7));
  kj::_::Debug::Fault::fatal(&local_190);
}

Assistant:

kj::Array<word> StructReader::canonicalize() {
  auto size = totalSize().wordCount + POINTER_SIZE_IN_WORDS;
  kj::Array<word> backing = kj::heapArray<word>(unbound(size / WORDS));
  WireHelpers::zeroMemory(backing.asPtr());
  FlatMessageBuilder builder(backing);
  _::PointerHelpers<AnyPointer>::getInternalBuilder(builder.initRoot<AnyPointer>()).setStruct(*this, true);
  KJ_ASSERT(builder.isCanonical());
  auto output = builder.getSegmentsForOutput()[0];
  kj::Array<word> trunc = kj::heapArray<word>(output.size());
  WireHelpers::copyMemory(trunc.begin(), output);
  return trunc;
}